

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Value * __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_3,_2>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_3,_2>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  Vector<float,_3> *pVVar1;
  int row;
  long lVar2;
  Precision PVar3;
  Precision extraout_EDX;
  Precision extraout_EDX_00;
  Value *this_00;
  float fVar4;
  
  PVar3 = (Precision)fmt;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  lVar2 = 0;
  do {
    fVar4 = 1.0;
    if (lVar2 != 0) {
      fVar4 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[0].m_data[lVar2] = fVar4;
    fVar4 = 1.0;
    if (lVar2 != 1) {
      fVar4 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[1].m_data[lVar2] = fVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = -3;
  this_00 = __return_storage_ptr__;
  do {
    fVar4 = DefaultSampling<float>::genRandom((DefaultSampling<float> *)this_00,fmt,PVar3,rnd);
    (__return_storage_ptr__->m_data).m_data[1].m_data[lVar2] = fVar4;
    fVar4 = DefaultSampling<float>::genRandom
                      ((DefaultSampling<float> *)this_00,fmt,extraout_EDX,rnd);
    __return_storage_ptr__[1].m_data.m_data[0].m_data[lVar2] = fVar4;
    lVar2 = lVar2 + 1;
    PVar3 = extraout_EDX_00;
  } while (lVar2 != 0);
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}